

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

int secp256k1_gej_eq_x_var(secp256k1_fe *x,secp256k1_gej *a)

{
  int iVar1;
  secp256k1_fe r2;
  secp256k1_fe r;
  secp256k1_fe local_68;
  secp256k1_fe local_40;
  
  secp256k1_fe_sqr(&local_40,&a->z);
  secp256k1_fe_mul(&local_40,&local_40,x);
  local_68.n[4] = (a->x).n[4];
  local_68.n[0] = (a->x).n[0];
  local_68.n[1] = (a->x).n[1];
  local_68.n[2] = (a->x).n[2];
  local_68.n[3] = (a->x).n[3];
  secp256k1_fe_normalize_weak(&local_68);
  iVar1 = secp256k1_fe_equal_var(&local_40,&local_68);
  return iVar1;
}

Assistant:

static int secp256k1_gej_eq_x_var(const secp256k1_fe *x, const secp256k1_gej *a) {
    secp256k1_fe r, r2;
    VERIFY_CHECK(!a->infinity);
    secp256k1_fe_sqr(&r, &a->z); secp256k1_fe_mul(&r, &r, x);
    r2 = a->x; secp256k1_fe_normalize_weak(&r2);
    return secp256k1_fe_equal_var(&r, &r2);
}